

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenutypes.cpp
# Opt level: O0

QDBusArgument * operator<<(QDBusArgument *arg,QDBusMenuLayoutItem *item)

{
  bool bVar1;
  const_iterator o;
  int *in_RSI;
  QDBusMenuLayoutItem *in_RDI;
  long in_FS_OFFSET;
  QDBusMenuLayoutItem *child;
  QList<QDBusMenuLayoutItem> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QVariant *in_stack_ffffffffffffff68;
  QList<QDBusMenuLayoutItem> *in_stack_ffffffffffffff70;
  QDBusMenuLayoutItem *this;
  QDBusMenuLayoutItem *value;
  QVariantMap *in_stack_ffffffffffffffa8;
  const_iterator in_stack_ffffffffffffffb0;
  QVariant local_48;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::beginStructure();
  QDBusArgument::operator<<((QDBusArgument *)in_RDI,*in_RSI);
  operator<<((QDBusArgument *)in_stack_ffffffffffffffb0.i,in_stack_ffffffffffffffa8);
  value = in_RDI;
  qMetaTypeId<QDBusVariant>();
  QDBusArgument::beginArray
            ((QDBusArgument *)in_stack_ffffffffffffff70,
             (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  QList<QDBusMenuLayoutItem>::begin(in_stack_ffffffffffffff70);
  o = QList<QDBusMenuLayoutItem>::end(in_stack_ffffffffffffff70);
  while( true ) {
    bVar1 = QList<QDBusMenuLayoutItem>::const_iterator::operator!=
                      ((const_iterator *)&stack0xffffffffffffffb0,o);
    if (!bVar1) break;
    QList<QDBusMenuLayoutItem>::const_iterator::operator*
              ((const_iterator *)&stack0xffffffffffffffb0);
    this = in_RDI;
    QVariant::fromValue<QDBusMenuLayoutItem>(value);
    QDBusVariant::QDBusVariant((QDBusVariant *)this,in_stack_ffffffffffffff68);
    QDBusArgument::operator<<((QDBusArgument *)this,(QDBusVariant *)local_28);
    QDBusVariant::~QDBusVariant((QDBusVariant *)0xaf61fe);
    QVariant::~QVariant(&local_48);
    QList<QDBusMenuLayoutItem>::const_iterator::operator++
              ((const_iterator *)&stack0xffffffffffffffb0);
  }
  QDBusArgument::endArray();
  QDBusArgument::endStructure();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDBusArgument *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

const QDBusArgument &operator<<(QDBusArgument &arg, const QDBusMenuLayoutItem &item)
{
    arg.beginStructure();
    arg << item.m_id << item.m_properties;
    arg.beginArray(qMetaTypeId<QDBusVariant>());
    for (const QDBusMenuLayoutItem &child : item.m_children)
        arg << QDBusVariant(QVariant::fromValue<QDBusMenuLayoutItem>(child));
    arg.endArray();
    arg.endStructure();
    return arg;
}